

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg.cpp
# Opt level: O2

CFG * wasm::analysis::CFG::fromFunction(CFG *__return_storage_ptr__,Function *func)

{
  map<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*,_unsigned_long,_std::less<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*>,_std::allocator<std::pair<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*const,_unsigned_long>_>_>
  *pmVar1;
  pointer ppEVar2;
  _Hash_node_base _Var3;
  _Hash_node_base *p_Var4;
  pointer ppBVar5;
  uint __line;
  undefined1 auVar6 [8];
  BasicBlock *pBVar7;
  BasicBlock *__s;
  pointer *pppEVar8;
  mapped_type *ppBVar9;
  Expression **ppEVar10;
  pointer pBVar11;
  _Hash_node_base _Var12;
  char *__function;
  ulong uVar13;
  __buckets_ptr __n;
  ulong uVar14;
  _Link_type __x;
  pointer __n_00;
  char *__file;
  char *__assertion;
  pointer pBVar15;
  vector<const_wasm::analysis::BasicBlock_*,_std::allocator<const_wasm::analysis::BasicBlock_*>_>
  *pvVar16;
  pointer ppBVar17;
  undefined1 auVar18 [16];
  undefined1 auStack_2f8 [8];
  CFGBuilder builder;
  undefined1 auStack_a8 [8];
  CFG cfg;
  BasicBlock *local_80;
  BasicBlock *oldPred;
  undefined1 local_70 [8];
  unordered_map<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*,_wasm::analysis::BasicBlock_*,_std::hash<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*>,_std::equal_to<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*>,_std::allocator<std::pair<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*const,_wasm::analysis::BasicBlock_*>_>_>
  oldToNewBlocks;
  __buckets_alloc_type __alloc;
  
  builder.
  super_CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
  .branches._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)
       &builder.
        super_CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
        .branches;
  auStack_2f8 = (undefined1  [8])0x0;
  builder.
  super_CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
  .super_PostWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>_>.
  super_Walker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>_>.replacep =
       (Expression **)0x0;
  builder.
  super_CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
  .branches._M_t._M_impl._0_4_ = 0;
  builder.
  super_CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
  .branches._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  builder.
  super_CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
  .branches._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  builder.
  super_CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
  .super_PostWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>_>.
  super_Walker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>_>.stack.fixed._M_elems
  [9].currp = (Expression **)0x0;
  builder.
  super_CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
  .super_PostWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>_>.
  super_Walker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>_>.stack.flexible.
  super__Vector_base<wasm::Walker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>_>::Task,_std::allocator<wasm::Walker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>_>::Task>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  builder.
  super_CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
  .super_PostWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>_>.
  super_Walker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>_>.stack.flexible.
  super__Vector_base<wasm::Walker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>_>::Task,_std::allocator<wasm::Walker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>_>::Task>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  builder.
  super_CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
  .super_PostWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>_>.
  super_Walker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>_>.stack.flexible.
  super__Vector_base<wasm::Walker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>_>::Task,_std::allocator<wasm::Walker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>_>::Task>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  builder.
  super_CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
  .super_PostWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>_>.
  super_Walker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>_>.currFunction =
       (Function *)0x0;
  builder.
  super_CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
  .super_PostWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>_>.
  super_Walker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>_>.currModule =
       (Module *)0x0;
  builder.
  super_CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
  .entry = (BasicBlock *)0x0;
  builder.
  super_CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
  .exit = (BasicBlock *)0x0;
  builder.
  super_CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
  .loopTops.
  super__Vector_base<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*,_std::allocator<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  builder.
  super_CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
  .basicBlocks.
  super__Vector_base<std::unique_ptr<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock,_std::default_delete<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock>_>,_std::allocator<std::unique_ptr<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock,_std::default_delete<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  builder.
  super_CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
  .basicBlocks.
  super__Vector_base<std::unique_ptr<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock,_std::default_delete<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock>_>,_std::allocator<std::unique_ptr<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock,_std::default_delete<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  builder.
  super_CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
  .basicBlocks.
  super__Vector_base<std::unique_ptr<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock,_std::default_delete<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock>_>,_std::allocator<std::unique_ptr<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock,_std::default_delete<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  builder.
  super_CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
  .loopTops.
  super__Vector_base<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*,_std::allocator<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  pmVar1 = &builder.
            super_CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
            .debugIds;
  builder.
  super_CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
  .debugIds._M_t._M_impl._0_4_ = 0;
  builder.
  super_CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
  .debugIds._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  builder.
  super_CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
  .debugIds._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  __x = (_Link_type)0x0;
  builder.
  super_CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
  .branches._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       builder.
       super_CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
       .branches._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  memset(&builder.
          super_CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
          .branches._M_t._M_impl.super__Rb_tree_header._M_header._M_right,0,0xb2);
  builder.
  super_CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
  .debugIds._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  builder.
  super_CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
  .super_PostWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>_>.
  super_Walker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>_>.stack.flexible.
  super__Vector_base<wasm::Walker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>_>::Task,_std::allocator<wasm::Walker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>_>::Task>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)func;
  builder.
  super_CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
  .debugIds._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)pmVar1;
  builder.
  super_CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
  .debugIds._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)pmVar1;
  std::
  _Rb_tree<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*,_std::pair<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*const,_unsigned_long>,_std::_Select1st<std::pair<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*const,_unsigned_long>_>,_std::less<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*>,_std::allocator<std::pair<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*const,_unsigned_long>_>_>
  ::_M_erase((_Rb_tree<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*,_std::pair<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*const,_unsigned_long>,_std::_Select1st<std::pair<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*const,_unsigned_long>_>,_std::less<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*>,_std::allocator<std::pair<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*const,_unsigned_long>_>_>
              *)0x0,__x);
  builder.
  super_CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
  .debugIds._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  builder.
  super_CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
  .debugIds._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  builder.
  super_CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
  .debugIds._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  builder.
  super_CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
  .entry = (BasicBlock *)0x0;
  builder.
  super_CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
  .catchIndexStack.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_1_ = '\0';
  builder.
  super_CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
  .debugIds._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)pmVar1;
  builder.
  super_CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
  .debugIds._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)pmVar1;
  CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
  ::startBasicBlock((CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
                     *)auStack_2f8);
  builder.
  super_CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
  .super_PostWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>_>.
  super_Walker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>_>.currModule =
       (Module *)
       builder.
       super_CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
       .loopTops.
       super__Vector_base<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*,_std::allocator<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  if (((long)builder.
             super_CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
             .super_PostWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>_>.
             super_Walker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>_>.stack.
             flexible.
             super__Vector_base<wasm::Walker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>_>::Task,_std::allocator<wasm::Walker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>_>::Task>_>
             ._M_impl.super__Vector_impl_data._M_start -
       (long)builder.
             super_CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
             .super_PostWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>_>.
             super_Walker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>_>.stack.fixed
             ._M_elems[9].currp >> 4) +
      (long)builder.
            super_CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
            .super_PostWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>_>.
            super_Walker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>_>.replacep !=
      0) {
    __assert_fail("stack.size() == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-traversal.h"
                  ,0x12d,
                  "void wasm::Walker<CFGBuilder, wasm::UnifiedExpressionVisitor<CFGBuilder>>::walk(Expression *&) [SubType = CFGBuilder, VisitorType = wasm::UnifiedExpressionVisitor<CFGBuilder>]"
                 );
  }
  Walker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>_>::pushTask
            ((Walker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>_> *)auStack_2f8,
             CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
             ::scan,&func->body);
  do {
    if (((long)builder.
               super_CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
               .super_PostWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>_>.
               super_Walker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>_>.stack.
               flexible.
               super__Vector_base<wasm::Walker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>_>::Task,_std::allocator<wasm::Walker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>_>::Task>_>
               ._M_impl.super__Vector_impl_data._M_start -
         (long)builder.
               super_CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
               .super_PostWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>_>.
               super_Walker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>_>.stack.
               fixed._M_elems[9].currp >> 4) +
        (long)builder.
              super_CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
              .super_PostWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>_>.
              super_Walker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>_>.replacep
        == 0) {
      if (builder.
          super_CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
          .loopTops.
          super__Vector_base<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*,_std::allocator<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
        CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
        ::doEndReturn((CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
                       *)auStack_2f8,(CFGBuilder *)0x0,
                      (Expression **)
                      builder.
                      super_CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
                      .
                      super_PostWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>_>
                      .super_Walker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>_>.
                      stack.flexible.
                      super__Vector_base<wasm::Walker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>_>::Task,_std::allocator<wasm::Walker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>_>::Task>_>
                      ._M_impl.super__Vector_impl_data._M_start);
      }
      if ((char)builder.
                super_CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
                .catchIndexStack.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage == '\x01') {
        local_70 = (undefined1  [8])
                   builder.
                   super_CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
                   .entry;
        std::
        vector<std::unique_ptr<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock,_std::default_delete<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock>_>,_std::allocator<std::unique_ptr<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock,_std::default_delete<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock>_>_>_>
        ::push_back((vector<std::unique_ptr<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock,_std::default_delete<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock>_>,_std::allocator<std::unique_ptr<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock,_std::default_delete<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock>_>_>_>
                     *)&builder.
                        super_CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
                        .exit,(value_type *)local_70);
        std::
        unique_ptr<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock,_std::default_delete<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock>_>
        ::~unique_ptr((unique_ptr<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock,_std::default_delete<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock>_>
                       *)local_70);
      }
      if (builder.
          super_CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
          .branches._M_t._M_impl.super__Rb_tree_header._M_header._M_right != (_Base_ptr)0x0) {
        __assert_fail("branches.size() == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/cfg/cfg-traversal.h"
                      ,0x255,
                      "void wasm::CFGWalker<CFGBuilder, wasm::UnifiedExpressionVisitor<CFGBuilder>, std::vector<wasm::Expression *>>::doWalkFunction(Function *) [SubType = CFGBuilder, VisitorType = wasm::UnifiedExpressionVisitor<CFGBuilder>, Contents = std::vector<wasm::Expression *>]"
                     );
      }
      if (builder.
          super_CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
          .ifLastBlockStack.
          super__Vector_base<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*,_std::allocator<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          (pointer)builder.
                   super_CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
                   .branches._M_t._M_impl.super__Rb_tree_header._M_node_count) {
        __assert_fail("ifLastBlockStack.size() == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/cfg/cfg-traversal.h"
                      ,0x256,
                      "void wasm::CFGWalker<CFGBuilder, wasm::UnifiedExpressionVisitor<CFGBuilder>, std::vector<wasm::Expression *>>::doWalkFunction(Function *) [SubType = CFGBuilder, VisitorType = wasm::UnifiedExpressionVisitor<CFGBuilder>, Contents = std::vector<wasm::Expression *>]"
                     );
      }
      if (builder.
          super_CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
          .loopLastBlockStack.
          super__Vector_base<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*,_std::allocator<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          builder.
          super_CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
          .ifLastBlockStack.
          super__Vector_base<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*,_std::allocator<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        __assert_fail("loopLastBlockStack.size() == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/cfg/cfg-traversal.h"
                      ,599,
                      "void wasm::CFGWalker<CFGBuilder, wasm::UnifiedExpressionVisitor<CFGBuilder>, std::vector<wasm::Expression *>>::doWalkFunction(Function *) [SubType = CFGBuilder, VisitorType = wasm::UnifiedExpressionVisitor<CFGBuilder>, Contents = std::vector<wasm::Expression *>]"
                     );
      }
      if (builder.
          super_CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
          .tryLastBlockStack.
          super__Vector_base<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*,_std::allocator<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          builder.
          super_CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
          .loopLastBlockStack.
          super__Vector_base<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*,_std::allocator<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        __assert_fail("tryLastBlockStack.size() == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/cfg/cfg-traversal.h"
                      ,600,
                      "void wasm::CFGWalker<CFGBuilder, wasm::UnifiedExpressionVisitor<CFGBuilder>, std::vector<wasm::Expression *>>::doWalkFunction(Function *) [SubType = CFGBuilder, VisitorType = wasm::UnifiedExpressionVisitor<CFGBuilder>, Contents = std::vector<wasm::Expression *>]"
                     );
      }
      if (builder.
          super_CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
          .throwingInstsStack.
          super__Vector_base<std::vector<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*,_std::allocator<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*>_>,_std::allocator<std::vector<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*,_std::allocator<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          (pointer)builder.
                   super_CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
                   .tryLastBlockStack.
                   super__Vector_base<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*,_std::allocator<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        __assert_fail("throwingInstsStack.size() == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/cfg/cfg-traversal.h"
                      ,0x259,
                      "void wasm::CFGWalker<CFGBuilder, wasm::UnifiedExpressionVisitor<CFGBuilder>, std::vector<wasm::Expression *>>::doWalkFunction(Function *) [SubType = CFGBuilder, VisitorType = wasm::UnifiedExpressionVisitor<CFGBuilder>, Contents = std::vector<wasm::Expression *>]"
                     );
      }
      if ((pointer)builder.
                   super_CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
                   .tryStack.
                   super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                   _M_impl.super__Vector_impl_data._M_start !=
          builder.
          super_CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
          .throwingInstsStack.
          super__Vector_base<std::vector<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*,_std::allocator<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*>_>,_std::allocator<std::vector<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*,_std::allocator<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        __assert_fail("tryStack.size() == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/cfg/cfg-traversal.h"
                      ,0x25a,
                      "void wasm::CFGWalker<CFGBuilder, wasm::UnifiedExpressionVisitor<CFGBuilder>, std::vector<wasm::Expression *>>::doWalkFunction(Function *) [SubType = CFGBuilder, VisitorType = wasm::UnifiedExpressionVisitor<CFGBuilder>, Contents = std::vector<wasm::Expression *>]"
                     );
      }
      if (builder.
          super_CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
          .processCatchStack.
          super__Vector_base<std::vector<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*,_std::allocator<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*>_>,_std::allocator<std::vector<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*,_std::allocator<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          (pointer)builder.
                   super_CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
                   .tryStack.
                   super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage) {
        __assert_fail("processCatchStack.size() == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/cfg/cfg-traversal.h"
                      ,0x25b,
                      "void wasm::CFGWalker<CFGBuilder, wasm::UnifiedExpressionVisitor<CFGBuilder>, std::vector<wasm::Expression *>>::doWalkFunction(Function *) [SubType = CFGBuilder, VisitorType = wasm::UnifiedExpressionVisitor<CFGBuilder>, Contents = std::vector<wasm::Expression *>]"
                     );
      }
      builder.
      super_CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
      .super_PostWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>_>.
      super_Walker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>_>.stack.flexible.
      super__Vector_base<wasm::Walker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>_>::Task,_std::allocator<wasm::Walker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>_>::Task>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      __n_00 = (pointer)((long)builder.
                               super_CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
                               .basicBlocks.
                               super__Vector_base<std::unique_ptr<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock,_std::default_delete<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock>_>,_std::allocator<std::unique_ptr<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock,_std::default_delete<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start -
                         (long)builder.
                               super_CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
                               .exit >> 3);
      auStack_a8 = (undefined1  [8])0x0;
      cfg.blocks.
      super__Vector_base<wasm::analysis::BasicBlock,_std::allocator<wasm::analysis::BasicBlock>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      cfg.blocks.
      super__Vector_base<wasm::analysis::BasicBlock,_std::allocator<wasm::analysis::BasicBlock>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      std::vector<wasm::analysis::BasicBlock,_std::allocator<wasm::analysis::BasicBlock>_>::vector
                ((vector<wasm::analysis::BasicBlock,_std::allocator<wasm::analysis::BasicBlock>_> *)
                 local_70,(size_type)__n_00,(allocator_type *)&stack0xffffffffffffff80);
      std::vector<wasm::analysis::BasicBlock,_std::allocator<wasm::analysis::BasicBlock>_>::
      _M_move_assign((vector<wasm::analysis::BasicBlock,_std::allocator<wasm::analysis::BasicBlock>_>
                      *)auStack_a8,
                     (vector<wasm::analysis::BasicBlock,_std::allocator<wasm::analysis::BasicBlock>_>
                      *)local_70);
      std::vector<wasm::analysis::BasicBlock,_std::allocator<wasm::analysis::BasicBlock>_>::~vector
                ((vector<wasm::analysis::BasicBlock,_std::allocator<wasm::analysis::BasicBlock>_> *)
                 local_70);
      local_70 = (undefined1  [8])&oldToNewBlocks._M_h._M_rehash_policy._M_next_resize;
      oldToNewBlocks._M_h._M_buckets = (__buckets_ptr)0x1;
      oldToNewBlocks._M_h._M_bucket_count = 0;
      oldToNewBlocks._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      oldToNewBlocks._M_h._M_element_count._0_4_ = 0x3f800000;
      oldToNewBlocks._M_h._M_rehash_policy._M_max_load_factor = 0.0;
      oldToNewBlocks._M_h._M_rehash_policy._4_4_ = 0;
      oldToNewBlocks._M_h._M_rehash_policy._M_next_resize = 0;
      for (pBVar11 = (pointer)0x0; pBVar11 != __n_00; pBVar11 = (pointer)((long)&pBVar11->index + 1)
          ) {
        pBVar15 = (pointer)((long)auStack_a8 + pBVar11 * 0x50);
        ppEVar2 = (&((builder.
                      super_CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
                     .exit)->contents).
                    super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                    _M_impl.super__Vector_impl_data._M_start)[(long)pBVar11];
        uVar13 = (ulong)ppEVar2 % (ulong)oldToNewBlocks._M_h._M_buckets;
        builder.
        super_CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
        .debugIds._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)ppEVar2;
        pBVar7 = (BasicBlock *)
                 std::
                 _Hashtable<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*,_std::pair<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*const,_wasm::analysis::BasicBlock_*>,_std::allocator<std::pair<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*const,_wasm::analysis::BasicBlock_*>_>,_std::__detail::_Select1st,_std::equal_to<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*>,_std::hash<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 ::_M_find_node((_Hashtable<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*,_std::pair<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*const,_wasm::analysis::BasicBlock_*>,_std::allocator<std::pair<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*const,_wasm::analysis::BasicBlock_*>_>,_std::__detail::_Select1st,_std::equal_to<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*>,_std::hash<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                                 *)local_70,uVar13,
                                (key_type *)
                                &builder.
                                 super_CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
                                 .debugIds._M_t._M_impl.super__Rb_tree_header._M_node_count,
                                (__hash_code)pBVar11);
        if (pBVar7 == (BasicBlock *)0x0) {
          cfg.blocks.
          super__Vector_base<wasm::analysis::BasicBlock,_std::allocator<wasm::analysis::BasicBlock>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = pBVar11;
          local_80 = (BasicBlock *)local_70;
          pBVar7 = (BasicBlock *)operator_new(0x18);
          (pBVar7->contents).
          super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          (pBVar7->contents).
          super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
          super__Vector_impl_data._M_finish = ppEVar2;
          (pBVar7->contents).
          super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          oldPred = pBVar7;
          auVar18 = std::__detail::_Prime_rehash_policy::_M_need_rehash
                              ((ulong)&oldToNewBlocks._M_h._M_element_count,
                               (ulong)oldToNewBlocks._M_h._M_buckets,
                               (ulong)oldToNewBlocks._M_h._M_before_begin._M_nxt);
          __n = auVar18._8_8_;
          if ((auVar18 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            if (__n == (__buckets_ptr)0x1) {
              oldToNewBlocks._M_h._M_rehash_policy._M_next_resize = 0;
              __s = (BasicBlock *)&oldToNewBlocks._M_h._M_rehash_policy._M_next_resize;
            }
            else {
              __s = (BasicBlock *)
                    std::allocator_traits<std::allocator<std::__detail::_Hash_node_base_*>_>::
                    allocate((allocator_type *)((long)&oldToNewBlocks._M_h._M_single_bucket + 7),
                             (size_type)__n);
              memset(__s,0,(long)__n * 8);
            }
            _Var3._M_nxt = (_Hash_node_base *)oldToNewBlocks._M_h._M_bucket_count;
            oldToNewBlocks._M_h._M_bucket_count = 0;
            uVar13 = 0;
LAB_00d1fb61:
            uVar14 = uVar13;
            _Var12._M_nxt = _Var3._M_nxt;
            if (_Var12._M_nxt != (_Hash_node_base *)0x0) {
              _Var3._M_nxt = (_Var12._M_nxt)->_M_nxt;
              uVar13 = (ulong)_Var12._M_nxt[1]._M_nxt % (ulong)__n;
              p_Var4 = (_Hash_node_base *)
                       (&(__s->contents).
                         super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                         ._M_impl.super__Vector_impl_data._M_start)[uVar13];
              if (p_Var4 == (_Hash_node_base *)0x0) goto LAB_00d1fb90;
              (_Var12._M_nxt)->_M_nxt = p_Var4->_M_nxt;
              pppEVar8 = (pointer *)
                         (&(__s->contents).
                           super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                           ._M_impl.super__Vector_impl_data._M_start)[uVar13];
              uVar13 = uVar14;
              goto LAB_00d1fbad;
            }
            std::
            _Hashtable<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*,_std::pair<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*const,_wasm::analysis::BasicBlock_*>,_std::allocator<std::pair<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*const,_wasm::analysis::BasicBlock_*>_>,_std::__detail::_Select1st,_std::equal_to<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*>,_std::hash<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::_M_deallocate_buckets
                      ((_Hashtable<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*,_std::pair<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*const,_wasm::analysis::BasicBlock_*>,_std::allocator<std::pair<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*const,_wasm::analysis::BasicBlock_*>_>,_std::__detail::_Select1st,_std::equal_to<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*>,_std::hash<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                        *)local_70);
            oldToNewBlocks._M_h._M_buckets = __n;
            local_70 = (undefined1  [8])__s;
            uVar13 = (ulong)ppEVar2 % (ulong)__n;
          }
          p_Var4 = *(_Hash_node_base **)((long)local_70 + uVar13 * 8);
          if (p_Var4 == (_Hash_node_base *)0x0) {
            (pBVar7->contents).
            super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)oldToNewBlocks._M_h._M_bucket_count;
            if (oldToNewBlocks._M_h._M_bucket_count != 0) {
              *(BasicBlock **)
               ((long)local_70 +
               (*(ulong *)(oldToNewBlocks._M_h._M_bucket_count + 8) %
               (ulong)oldToNewBlocks._M_h._M_buckets) * 8) = pBVar7;
            }
            *(size_type **)((long)local_70 + uVar13 * 8) = &oldToNewBlocks._M_h._M_bucket_count;
            oldToNewBlocks._M_h._M_bucket_count = (size_type)pBVar7;
          }
          else {
            (pBVar7->contents).
            super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)p_Var4->_M_nxt;
            (*(_Hash_node_base **)((long)local_70 + uVar13 * 8))->_M_nxt = (_Hash_node_base *)pBVar7
            ;
          }
          oldToNewBlocks._M_h._M_before_begin._M_nxt =
               (_Hash_node_base *)((long)&(oldToNewBlocks._M_h._M_before_begin._M_nxt)->_M_nxt + 1);
          oldPred = (BasicBlock *)0x0;
          std::
          _Hashtable<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*,_std::pair<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*const,_wasm::analysis::BasicBlock_*>,_std::allocator<std::pair<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*const,_wasm::analysis::BasicBlock_*>_>,_std::__detail::_Select1st,_std::equal_to<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*>,_std::hash<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::_Scoped_node::~_Scoped_node((_Scoped_node *)&stack0xffffffffffffff80);
          pBVar11 = cfg.blocks.
                    super__Vector_base<wasm::analysis::BasicBlock,_std::allocator<wasm::analysis::BasicBlock>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage;
        }
        (pBVar7->contents).
        super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)pBVar15;
      }
      for (pBVar11 = (pointer)0x0; auVar6 = auStack_a8, pBVar11 != __n_00;
          pBVar11 = (pointer)((long)&pBVar11->index + 1)) {
        pBVar15 = (pointer)(&((builder.
                               super_CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
                              .exit)->contents).
                             super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                             ._M_impl.super__Vector_impl_data._M_start)[(long)pBVar11];
        ((pointer)((long)auStack_a8 + pBVar11 * 0x50))->index = (Index)pBVar11;
        std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::_M_move_assign
                  (&((pointer)((long)auStack_a8 + pBVar11 * 0x50))->insts,pBVar15);
        pvVar16 = &((pointer)((long)auVar6 + pBVar11 * 0x50))->predecessors;
        std::
        vector<const_wasm::analysis::BasicBlock_*,_std::allocator<const_wasm::analysis::BasicBlock_*>_>
        ::reserve(pvVar16,(long)(pBVar15->successors).
                                super__Vector_base<const_wasm::analysis::BasicBlock_*,_std::allocator<const_wasm::analysis::BasicBlock_*>_>
                                ._M_impl.super__Vector_impl_data._M_start -
                          (long)(pBVar15->predecessors).
                                super__Vector_base<const_wasm::analysis::BasicBlock_*,_std::allocator<const_wasm::analysis::BasicBlock_*>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage >> 3);
        ppBVar5 = (pBVar15->successors).
                  super__Vector_base<const_wasm::analysis::BasicBlock_*,_std::allocator<const_wasm::analysis::BasicBlock_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        cfg.blocks.
        super__Vector_base<wasm::analysis::BasicBlock,_std::allocator<wasm::analysis::BasicBlock>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = pBVar15;
        for (ppBVar17 = (pBVar15->predecessors).
                        super__Vector_base<const_wasm::analysis::BasicBlock_*,_std::allocator<const_wasm::analysis::BasicBlock_*>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage;
            pBVar15 = cfg.blocks.
                      super__Vector_base<wasm::analysis::BasicBlock,_std::allocator<wasm::analysis::BasicBlock>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage, ppBVar17 != ppBVar5;
            ppBVar17 = ppBVar17 + 1) {
          local_80 = *ppBVar17;
          ppBVar9 = std::
                    unordered_map<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*,_wasm::analysis::BasicBlock_*,_std::hash<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*>,_std::equal_to<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*>,_std::allocator<std::pair<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*const,_wasm::analysis::BasicBlock_*>_>_>
                    ::at((unordered_map<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*,_wasm::analysis::BasicBlock_*,_std::hash<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*>,_std::equal_to<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*>,_std::allocator<std::pair<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*const,_wasm::analysis::BasicBlock_*>_>_>
                          *)local_70,(key_type *)&stack0xffffffffffffff80);
          std::
          vector<const_wasm::analysis::BasicBlock_*,_std::allocator<const_wasm::analysis::BasicBlock_*>_>
          ::push_back(pvVar16,ppBVar9);
        }
        pvVar16 = &((pointer)((long)auVar6 + pBVar11 * 0x50))->successors;
        std::
        vector<const_wasm::analysis::BasicBlock_*,_std::allocator<const_wasm::analysis::BasicBlock_*>_>
        ::reserve(pvVar16,(long)((cfg.blocks.
                                  super__Vector_base<wasm::analysis::BasicBlock,_std::allocator<wasm::analysis::BasicBlock>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage)->predecessors)
                                .
                                super__Vector_base<const_wasm::analysis::BasicBlock_*,_std::allocator<const_wasm::analysis::BasicBlock_*>_>
                                ._M_impl.super__Vector_impl_data._M_start -
                          (long)((cfg.blocks.
                                  super__Vector_base<wasm::analysis::BasicBlock,_std::allocator<wasm::analysis::BasicBlock>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage)->insts).
                                super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage >> 3);
        ppBVar5 = (pBVar15->predecessors).
                  super__Vector_base<const_wasm::analysis::BasicBlock_*,_std::allocator<const_wasm::analysis::BasicBlock_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        for (ppBVar17 = (pointer)(pBVar15->insts).
                                 super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
            ppBVar17 != ppBVar5; ppBVar17 = ppBVar17 + 1) {
          local_80 = *ppBVar17;
          ppBVar9 = std::
                    unordered_map<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*,_wasm::analysis::BasicBlock_*,_std::hash<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*>,_std::equal_to<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*>,_std::allocator<std::pair<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*const,_wasm::analysis::BasicBlock_*>_>_>
                    ::at((unordered_map<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*,_wasm::analysis::BasicBlock_*,_std::hash<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*>,_std::equal_to<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*>,_std::allocator<std::pair<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*const,_wasm::analysis::BasicBlock_*>_>_>
                          *)local_70,(key_type *)&stack0xffffffffffffff80);
          std::
          vector<const_wasm::analysis::BasicBlock_*,_std::allocator<const_wasm::analysis::BasicBlock_*>_>
          ::push_back(pvVar16,ppBVar9);
        }
      }
      if (auStack_a8 !=
          (undefined1  [8])
          cfg.blocks.
          super__Vector_base<wasm::analysis::BasicBlock,_std::allocator<wasm::analysis::BasicBlock>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        *(bool *)((long)auStack_a8 + 4) = true;
        if (builder.
            super_CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
            .entry != (BasicBlock *)0x0) {
          ppBVar9 = std::
                    unordered_map<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*,_wasm::analysis::BasicBlock_*,_std::hash<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*>,_std::equal_to<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*>,_std::allocator<std::pair<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*const,_wasm::analysis::BasicBlock_*>_>_>
                    ::at((unordered_map<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*,_wasm::analysis::BasicBlock_*,_std::hash<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*>,_std::equal_to<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*>,_std::allocator<std::pair<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*const,_wasm::analysis::BasicBlock_*>_>_>
                          *)local_70,
                         &builder.
                          super_CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
                          .entry);
          (*ppBVar9)->exit = true;
        }
        (__return_storage_ptr__->blocks).
        super__Vector_base<wasm::analysis::BasicBlock,_std::allocator<wasm::analysis::BasicBlock>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)auStack_a8;
        (__return_storage_ptr__->blocks).
        super__Vector_base<wasm::analysis::BasicBlock,_std::allocator<wasm::analysis::BasicBlock>_>.
        _M_impl.super__Vector_impl_data._M_finish =
             cfg.blocks.
             super__Vector_base<wasm::analysis::BasicBlock,_std::allocator<wasm::analysis::BasicBlock>_>
             ._M_impl.super__Vector_impl_data._M_start;
        (__return_storage_ptr__->blocks).
        super__Vector_base<wasm::analysis::BasicBlock,_std::allocator<wasm::analysis::BasicBlock>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage =
             cfg.blocks.
             super__Vector_base<wasm::analysis::BasicBlock,_std::allocator<wasm::analysis::BasicBlock>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        auStack_a8 = (undefined1  [8])0x0;
        cfg.blocks.
        super__Vector_base<wasm::analysis::BasicBlock,_std::allocator<wasm::analysis::BasicBlock>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        cfg.blocks.
        super__Vector_base<wasm::analysis::BasicBlock,_std::allocator<wasm::analysis::BasicBlock>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        std::
        unordered_map<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*,_wasm::analysis::BasicBlock_*,_std::hash<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*>,_std::equal_to<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*>,_std::allocator<std::pair<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*const,_wasm::analysis::BasicBlock_*>_>_>
        ::~unordered_map((unordered_map<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*,_wasm::analysis::BasicBlock_*,_std::hash<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*>,_std::equal_to<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*>,_std::allocator<std::pair<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*const,_wasm::analysis::BasicBlock_*>_>_>
                          *)local_70);
        std::vector<wasm::analysis::BasicBlock,_std::allocator<wasm::analysis::BasicBlock>_>::
        ~vector((vector<wasm::analysis::BasicBlock,_std::allocator<wasm::analysis::BasicBlock>_> *)
                auStack_a8);
        CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
        ::~CFGWalker((CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
                      *)auStack_2f8);
        return __return_storage_ptr__;
      }
      __assertion = "!cfg.blocks.empty()";
      __file = 
      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/analysis/cfg.cpp"
      ;
      __function = "static CFG wasm::analysis::CFG::fromFunction(Function *)";
      __line = 0x41;
LAB_00d1fe1d:
      __assert_fail(__assertion,__file,__line,__function);
    }
    if ((pointer)builder.
                 super_CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
                 .super_PostWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>_>.
                 super_Walker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>_>.stack.
                 fixed._M_elems[9].currp ==
        builder.
        super_CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
        .super_PostWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>_>.
        super_Walker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>_>.stack.flexible.
        super__Vector_base<wasm::Walker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>_>::Task,_std::allocator<wasm::Walker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>_>::Task>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      if (builder.
          super_CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
          .super_PostWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>_>.
          super_Walker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>_>.replacep ==
          (Expression **)0x0) {
        __assertion = "usedFixed > 0";
        __file = 
        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/support/small_vector.h"
        ;
        __function = 
        "T &wasm::SmallVector<wasm::Walker<CFGBuilder, wasm::UnifiedExpressionVisitor<CFGBuilder>>::Task, 10>::back() [T = wasm::Walker<CFGBuilder, wasm::UnifiedExpressionVisitor<CFGBuilder>>::Task, N = 10]"
        ;
        __line = 0x7e;
        goto LAB_00d1fe1d;
      }
      ppEVar10 = builder.
                 super_CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
                 .super_PostWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>_>.
                 super_Walker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>_>.stack.
                 fixed._M_elems
                 [(long)builder.
                        super_CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
                        .
                        super_PostWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>_>
                        .super_Walker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>_>
                        .replacep + -2].currp;
      auStack_2f8 = (undefined1  [8])
                    builder.
                    super_CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
                    .super_PostWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>_>
                    .super_Walker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>_>.
                    stack.fixed._M_elems
                    [(long)builder.
                           super_CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
                           .
                           super_PostWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>_>
                           .
                           super_Walker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>_>
                           .replacep + -1].func;
      builder.
      super_CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
      .super_PostWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>_>.
      super_Walker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>_>.replacep =
           (Expression **)
           ((long)builder.
                  super_CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
                  .super_PostWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>_>.
                  super_Walker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>_>.
                  replacep + -1);
    }
    else {
      ppEVar10 = (Expression **)
                 builder.
                 super_CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
                 .super_PostWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>_>.
                 super_Walker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>_>.stack.
                 flexible.
                 super__Vector_base<wasm::Walker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>_>::Task,_std::allocator<wasm::Walker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>_>::Task>_>
                 ._M_impl.super__Vector_impl_data._M_start[-1].func;
      auStack_2f8 = (undefined1  [8])
                    builder.
                    super_CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
                    .super_PostWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>_>
                    .super_Walker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>_>.
                    stack.flexible.
                    super__Vector_base<wasm::Walker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>_>::Task,_std::allocator<wasm::Walker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>_>::Task>_>
                    ._M_impl.super__Vector_impl_data._M_start[-1].currp;
      builder.
      super_CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
      .super_PostWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>_>.
      super_Walker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>_>.stack.flexible.
      super__Vector_base<wasm::Walker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>_>::Task,_std::allocator<wasm::Walker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>_>::Task>_>
      ._M_impl.super__Vector_impl_data._M_start =
           builder.
           super_CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
           .super_PostWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>_>.
           super_Walker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>_>.stack.
           flexible.
           super__Vector_base<wasm::Walker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>_>::Task,_std::allocator<wasm::Walker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>_>::Task>_>
           ._M_impl.super__Vector_impl_data._M_start + -1;
    }
    if (*(Expression **)auStack_2f8 == (Expression *)0x0) {
      __assert_fail("*task.currp",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-traversal.h"
                    ,0x132,
                    "void wasm::Walker<CFGBuilder, wasm::UnifiedExpressionVisitor<CFGBuilder>>::walk(Expression *&) [SubType = CFGBuilder, VisitorType = wasm::UnifiedExpressionVisitor<CFGBuilder>]"
                   );
    }
    (*(code *)ppEVar10)((CFGBuilder *)auStack_2f8,(Expression **)auStack_2f8);
  } while( true );
LAB_00d1fb90:
  (_Var12._M_nxt)->_M_nxt = (_Hash_node_base *)oldToNewBlocks._M_h._M_bucket_count;
  oldToNewBlocks._M_h._M_bucket_count = (size_type)_Var12._M_nxt;
  (&(__s->contents).super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
    _M_impl.super__Vector_impl_data._M_start)[uVar13] =
       (pointer)&oldToNewBlocks._M_h._M_bucket_count;
  if ((_Var12._M_nxt)->_M_nxt != (_Hash_node_base *)0x0) {
    pppEVar8 = &(__s->contents).
                super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
                super__Vector_impl_data._M_start + uVar14;
LAB_00d1fbad:
    *pppEVar8 = (pointer)_Var12._M_nxt;
  }
  goto LAB_00d1fb61;
}

Assistant:

CFG CFG::fromFunction(Function* func) {
  struct CFGBuilder : CFGWalker<CFGBuilder,
                                UnifiedExpressionVisitor<CFGBuilder>,
                                std::vector<Expression*>> {
    void visitExpression(Expression* curr) {
      if (currBasicBlock) {
        currBasicBlock->contents.push_back(curr);
      }
    }
  };

  CFGBuilder builder;
  builder.walkFunction(func);

  size_t numBlocks = builder.basicBlocks.size();

  CFG cfg;
  cfg.blocks = std::vector<BasicBlock>(numBlocks);

  // From here the addresses of the new basic blocks are stable.
  std::unordered_map<CFGBuilder::BasicBlock*, BasicBlock*> oldToNewBlocks;
  for (size_t i = 0; i < numBlocks; ++i) {
    oldToNewBlocks[builder.basicBlocks[i].get()] = &cfg.blocks[i];
  }

  for (size_t i = 0; i < numBlocks; ++i) {
    auto& oldBlock = *builder.basicBlocks[i];
    auto& newBlock = cfg.blocks[i];
    newBlock.index = i;
    newBlock.insts = std::move(oldBlock.contents);
    newBlock.predecessors.reserve(oldBlock.in.size());
    for (auto* oldPred : oldBlock.in) {
      newBlock.predecessors.push_back(oldToNewBlocks.at(oldPred));
    }
    newBlock.successors.reserve(oldBlock.out.size());
    for (auto* oldSucc : oldBlock.out) {
      newBlock.successors.push_back(oldToNewBlocks.at(oldSucc));
    }
  }

  assert(!cfg.blocks.empty());
  cfg.blocks[0].entry = true;
  if (builder.exit) {
    oldToNewBlocks.at(builder.exit)->exit = true;
  }

  // Move-construct a new CFG to get mandatory copy elision, preserving basic
  // block addresses through the return.
  return CFG(std::move(cfg));
}